

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O3

QString * __thiscall
QAccessibleDisplay::text(QString *__return_storage_ptr__,QAccessibleDisplay *this,Text t)

{
  double dVar1;
  Data *pDVar2;
  qsizetype qVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  QArrayData *pQVar7;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar8;
  char cVar9;
  TextFormat TVar10;
  int iVar11;
  QWidget *pQVar12;
  long lVar13;
  QLabel *this_00;
  QProgressBar *this_01;
  QLCDNumber *this_02;
  QStatusBar *this_03;
  char16_t *tmp_1;
  QTypedArrayData<char16_t> *tmp;
  long in_FS_OFFSET;
  QAnyStringView QVar14;
  undefined1 *local_88;
  undefined1 *puStack_80;
  QString local_78;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (char16_t *)0x0;
  local_58.d.size = 0;
  if (t == Value) {
    (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
    lVar13 = QMetaObject::cast((QObject *)&QProgressBar::staticMetaObject);
    pQVar7 = &(local_78.d.d)->super_QArrayData;
    aVar8.m_data_utf16 = local_78.d.ptr;
    if (lVar13 != 0) {
      (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
      this_01 = (QProgressBar *)QMetaObject::cast((QObject *)&QProgressBar::staticMetaObject);
      iVar11 = QProgressBar::value(this_01);
      QString::number((int)&local_78,iVar11);
      local_58.d.d = local_78.d.d;
      local_58.d.ptr = local_78.d.ptr;
      local_58.d.size = local_78.d.size;
      pQVar7 = &(local_78.d.d)->super_QArrayData;
      aVar8.m_data_utf16 = local_78.d.ptr;
    }
  }
  else {
    pQVar7 = &(local_78.d.d)->super_QArrayData;
    aVar8.m_data_utf16 = local_78.d.ptr;
    if (t == Name) {
      pQVar12 = QAccessibleWidget::widget(&this->super_QAccessibleWidget);
      QWidget::accessibleName(&local_78,pQVar12);
      aVar8.m_data_utf16 = local_78.d.ptr;
      pDVar2 = local_78.d.d;
      local_58.d.d = local_78.d.d;
      local_58.d.ptr = local_78.d.ptr;
      local_58.d.size = local_78.d.size;
      pQVar7 = &pDVar2->super_QArrayData;
      if (local_78.d.size == 0) {
        (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
        lVar13 = QMetaObject::cast((QObject *)&QLabel::staticMetaObject);
        (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
        if (lVar13 == 0) {
          lVar13 = QMetaObject::cast((QObject *)&QLCDNumber::staticMetaObject);
          (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
          if (lVar13 == 0) {
            lVar13 = QMetaObject::cast((QObject *)&QStatusBar::staticMetaObject);
            pQVar7 = &(local_78.d.d)->super_QArrayData;
            aVar8.m_data_utf16 = local_78.d.ptr;
            if (lVar13 != 0) {
              (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
              this_03 = (QStatusBar *)QMetaObject::cast((QObject *)&QStatusBar::staticMetaObject);
              QStatusBar::currentMessage(__return_storage_ptr__,this_03);
              if (&pDVar2->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
                }
              }
              goto LAB_005242f9;
            }
          }
          else {
            this_02 = (QLCDNumber *)QMetaObject::cast((QObject *)&QLCDNumber::staticMetaObject);
            iVar11 = QLCDNumber::digitCount(this_02);
            if (iVar11 == 0) {
              iVar11 = QLCDNumber::intValue(this_02);
              QString::number((int)&local_78,iVar11);
            }
            else {
              dVar1 = QLCDNumber::value(this_02);
              QString::number(dVar1,(char)&local_78,0x67);
            }
            local_58.d.size = local_78.d.size;
            local_58.d.d = local_78.d.d;
            local_58.d.ptr = local_78.d.ptr;
            local_78.d.size = 0;
            if (&pDVar2->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
              iVar11 = (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
              UNLOCK();
              local_58.d.d = local_78.d.d;
              local_78.d.d = pDVar2;
              local_78.d.ptr = aVar8.m_data_utf16;
              goto joined_r0x00524274;
            }
          }
        }
        else {
          this_00 = (QLabel *)QMetaObject::cast((QObject *)&QLabel::staticMetaObject);
          QLabel::text(&local_78,this_00);
          local_58.d.d = local_78.d.d;
          local_58.d.ptr = local_78.d.ptr;
          local_58.d.size = local_78.d.size;
          local_78.d.size = 0;
          local_78.d.d = pDVar2;
          local_78.d.ptr = aVar8.m_data_utf16;
          if (&pDVar2->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&pDVar2->super_QArrayData,2,0x10);
            }
          }
          TVar10 = QLabel::textFormat(this_00);
          if ((TVar10 == RichText) ||
             ((TVar10 = QLabel::textFormat(this_00), TVar10 == AutoText &&
              (QVar14.m_size = local_58.d.size | 0x8000000000000000,
              QVar14.field_0.m_data_utf16 = local_58.d.ptr, cVar9 = Qt::mightBeRichText(QVar14),
              cVar9 != '\0')))) {
            local_88 = &DAT_aaaaaaaaaaaaaaaa;
            puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
            QTextDocument::QTextDocument((QTextDocument *)&local_88,(QObject *)0x0);
            QTextDocument::setHtml((QString *)&local_88);
            QTextDocument::toPlainText();
            pcVar5 = local_58.d.ptr;
            pDVar4 = local_58.d.d;
            qVar3 = local_78.d.size;
            pDVar2 = local_78.d.d;
            local_78.d.d = local_58.d.d;
            local_58.d.d = pDVar2;
            local_58.d.ptr = local_78.d.ptr;
            local_78.d.ptr = pcVar5;
            local_78.d.size = local_58.d.size;
            local_58.d.size = qVar3;
            if (&pDVar4->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(&pDVar4->super_QArrayData,2,0x10);
              }
            }
            QTextDocument::~QTextDocument((QTextDocument *)&local_88);
          }
          pQVar12 = QLabel::buddy(this_00);
          pQVar7 = &(local_78.d.d)->super_QArrayData;
          aVar8.m_data_utf16 = local_78.d.ptr;
          if (pQVar12 != (QWidget *)0x0) {
            qt_accStripAmp(&local_78,&local_58);
            qVar6 = local_58.d.size;
            pcVar5 = local_58.d.ptr;
            pDVar4 = local_58.d.d;
            qVar3 = local_78.d.size;
            local_58.d.ptr = local_78.d.ptr;
            pDVar2 = local_78.d.d;
            local_78.d.d = local_58.d.d;
            local_58.d.d = pDVar2;
            local_78.d.ptr = pcVar5;
            local_78.d.size = local_58.d.size;
            local_58.d.size = qVar3;
            pQVar7 = &(local_78.d.d)->super_QArrayData;
            aVar8.m_data_utf16 = local_78.d.ptr;
            if (&pDVar4->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
              iVar11 = (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
              UNLOCK();
              local_78.d.size = qVar6;
              local_78.d.d = pDVar4;
joined_r0x00524274:
              pQVar7 = &(local_78.d.d)->super_QArrayData;
              aVar8.m_data_utf16 = local_78.d.ptr;
              if (iVar11 == 0) {
                QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
                pQVar7 = &(local_78.d.d)->super_QArrayData;
                aVar8.m_data_utf16 = local_78.d.ptr;
              }
            }
          }
        }
      }
    }
  }
  local_78.d.ptr = aVar8.m_data_utf16;
  local_78.d.d = (Data *)pQVar7;
  if (local_58.d.size == 0) {
    QAccessibleWidget::text(&local_78,&this->super_QAccessibleWidget,t);
    pcVar5 = local_58.d.ptr;
    pDVar4 = local_58.d.d;
    qVar3 = local_78.d.size;
    pDVar2 = local_78.d.d;
    local_78.d.d = local_58.d.d;
    local_58.d.d = pDVar2;
    local_58.d.ptr = local_78.d.ptr;
    local_78.d.ptr = pcVar5;
    local_78.d.size = local_58.d.size;
    local_58.d.size = qVar3;
    if (&pDVar4->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar4->super_QArrayData,2,0x10);
      }
    }
  }
  (__return_storage_ptr__->d).d = local_58.d.d;
  (__return_storage_ptr__->d).ptr = local_58.d.ptr;
  (__return_storage_ptr__->d).size = local_58.d.size;
LAB_005242f9:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QAccessibleDisplay::text(QAccessible::Text t) const
{
    QString str;
    switch (t) {
    case QAccessible::Name:
        str = widget()->accessibleName();
        if (str.isEmpty()) {
            if (false) {
#if QT_CONFIG(label)
            } else if (qobject_cast<QLabel*>(object())) {
                QLabel *label = qobject_cast<QLabel*>(object());
                str = label->text();
#ifndef QT_NO_TEXTHTMLPARSER
                if (label->textFormat() == Qt::RichText
                    || (label->textFormat() == Qt::AutoText && Qt::mightBeRichText(str))) {
                    QTextDocument doc;
                    doc.setHtml(str);
                    str = doc.toPlainText();
                }
#endif
#ifndef QT_NO_SHORTCUT
                if (label->buddy())
                    str = qt_accStripAmp(str);
#endif
#endif // QT_CONFIG(label)
#if QT_CONFIG(lcdnumber)
            } else if (qobject_cast<QLCDNumber*>(object())) {
                QLCDNumber *l = qobject_cast<QLCDNumber*>(object());
                if (l->digitCount())
                    str = QString::number(l->value());
                else
                    str = QString::number(l->intValue());
#endif
#if QT_CONFIG(statusbar)
            } else if (qobject_cast<QStatusBar*>(object())) {
                return qobject_cast<QStatusBar*>(object())->currentMessage();
#endif
            }
        }
        break;
    case QAccessible::Value:
#if QT_CONFIG(progressbar)
        if (qobject_cast<QProgressBar*>(object()))
            str = QString::number(qobject_cast<QProgressBar*>(object())->value());
#endif
        break;
    default:
        break;
    }
    if (str.isEmpty())
        str = QAccessibleWidget::text(t);
    return str;
}